

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

bool S_CheckSoundLimit(sfxinfo_t *sfx,FVector3 *pos,int near_limit,float limit_range,AActor *actor,
                      int channel)

{
  AActor *actor_00;
  bool bVar1;
  int iVar2;
  FSoundChan *pFVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  FVector3 chanorigin;
  
  iVar2 = 0;
  if (0 < near_limit && Channels != (FSoundChan *)0x0) {
    iVar2 = 0;
    pFVar3 = Channels;
    do {
      if (((pFVar3->ChanFlags & 2U) == 0) && (S_sfx.Array + (pFVar3->SoundID).ID == sfx)) {
        if ((actor == (AActor *)0x0) ||
           ((((uint)pFVar3->EntChannel != channel || (pFVar3->SourceType != '\x01')) ||
            ((pFVar3->field_12).Actor != actor)))) {
          actor_00 = (pFVar3->field_12).Actor;
          CalcPosVel((uint)pFVar3->SourceType,actor_00,(sector_t *)actor_00,(FPolyObj *)actor_00,
                     (pFVar3->field_12).Point,(uint)pFVar3->EntChannel,pFVar3->ChanFlags,&chanorigin
                     ,(FVector3 *)0x0);
          fVar4 = chanorigin.X - pos->X;
          fVar5 = chanorigin.Y - pos->Y;
          fVar6 = chanorigin.Z - pos->Z;
          iVar2 = iVar2 + (uint)(fVar6 * fVar6 + fVar5 * fVar5 + fVar4 * fVar4 <= limit_range);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (!bVar1) {
          return false;
        }
      }
      pFVar3 = pFVar3->NextChan;
    } while ((pFVar3 != (FSoundChan *)0x0) && (iVar2 < near_limit));
  }
  return near_limit <= iVar2;
}

Assistant:

bool S_CheckSoundLimit(sfxinfo_t *sfx, const FVector3 &pos, int near_limit, float limit_range,
	AActor *actor, int channel)
{
	FSoundChan *chan;
	int count;
	
	for (chan = Channels, count = 0; chan != NULL && count < near_limit; chan = chan->NextChan)
	{
		if (!(chan->ChanFlags & CHAN_EVICTED) && &S_sfx[chan->SoundID] == sfx)
		{
			FVector3 chanorigin;

			if (actor != NULL && chan->EntChannel == channel &&
				chan->SourceType == SOURCE_Actor && chan->Actor == actor)
			{ // We are restarting a playing sound. Always let it play.
				return false;
			}

			CalcPosVel(chan, &chanorigin, NULL);
			if ((chanorigin - pos).LengthSquared() <= limit_range)
			{
				count++;
			}
		}
	}
	return count >= near_limit;
}